

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

void Omega_h::set_component<signed_char>
               (Write<signed_char> *out,Read<signed_char> *a,Int ncomps,Int comp)

{
  int *piVar1;
  Alloc *pAVar2;
  LO n;
  type f;
  type local_30;
  
  local_30.out.shared_alloc_.alloc = (out->shared_alloc_).alloc;
  if (((ulong)local_30.out.shared_alloc_.alloc & 7) == 0 &&
      local_30.out.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_30.out.shared_alloc_.alloc = (Alloc *)((local_30.out.shared_alloc_.alloc)->size * 8 + 1)
      ;
    }
    else {
      (local_30.out.shared_alloc_.alloc)->use_count =
           (local_30.out.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_30.out.shared_alloc_.direct_ptr = (out->shared_alloc_).direct_ptr;
  pAVar2 = (a->write_).shared_alloc_.alloc;
  local_30.a.write_.shared_alloc_.alloc = pAVar2;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_30.a.write_.shared_alloc_.alloc = (Alloc *)(pAVar2->size * 8 + 1);
    }
    else {
      pAVar2->use_count = pAVar2->use_count + 1;
    }
  }
  local_30.a.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
  if (((ulong)pAVar2 & 1) == 0) {
    n = (LO)pAVar2->size;
  }
  else {
    n = (LO)((ulong)pAVar2 >> 3);
  }
  local_30.ncomps = ncomps;
  local_30.comp = comp;
  parallel_for<Omega_h::set_component<signed_char>(Omega_h::Write<signed_char>,Omega_h::Read<signed_char>,int,int)::_lambda(int)_1_>
            (n,&local_30,"set_component");
  pAVar2 = local_30.a.write_.shared_alloc_.alloc;
  if (((ulong)local_30.a.write_.shared_alloc_.alloc & 7) == 0 &&
      local_30.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_30.a.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_30.a.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_30.out.shared_alloc_.alloc;
  if (((ulong)local_30.out.shared_alloc_.alloc & 7) == 0 &&
      local_30.out.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_30.out.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_30.out.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  return;
}

Assistant:

bool are_close(Reals a, Reals b, Real tol, Real floor) {
  OMEGA_H_CHECK(a.size() == b.size());
  auto const first = IntIterator(0);
  auto const last = IntIterator(a.size());
  auto const init = true;
  auto const op = logical_and<bool>();
  auto transform = OMEGA_H_LAMBDA(LO i)->bool {
    return are_close(a[i], b[i], tol, floor);
  };
  auto const res =
      transform_reduce(first, last, init, op, std::move(transform));
  return static_cast<bool>(res);
}